

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_range(Curl_easy *data,Curl_HttpReq httpreq)

{
  char *pcVar1;
  long lVar2;
  curl_off_t total_expected_size;
  Curl_HttpReq httpreq_local;
  Curl_easy *data_local;
  
  if ((*(uint *)&(data->state).field_0x6d0 >> 9 & 1) != 0) {
    if (((httpreq == HTTPREQ_GET) || (httpreq == HTTPREQ_HEAD)) &&
       (pcVar1 = Curl_checkheaders(data,"Range",5), pcVar1 == (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.rangeline);
      pcVar1 = curl_maprintf("Range: bytes=%s\r\n",(data->state).range);
      (data->state).aptr.rangeline = pcVar1;
    }
    else if (((httpreq == HTTPREQ_POST) || (httpreq == HTTPREQ_PUT)) &&
            (pcVar1 = Curl_checkheaders(data,"Content-Range",0xd), pcVar1 == (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.rangeline);
      if ((data->set).set_resume_from < 0) {
        pcVar1 = curl_maprintf("Content-Range: bytes 0-%ld/%ld\r\n",(data->state).infilesize + -1,
                               (data->state).infilesize);
        (data->state).aptr.rangeline = pcVar1;
      }
      else if ((data->state).resume_from == 0) {
        pcVar1 = curl_maprintf("Content-Range: bytes %s/%ld\r\n",(data->state).range,
                               (data->state).infilesize);
        (data->state).aptr.rangeline = pcVar1;
      }
      else {
        lVar2 = (data->state).resume_from + (data->state).infilesize;
        pcVar1 = curl_maprintf("Content-Range: bytes %s%ld/%ld\r\n",(data->state).range,lVar2 + -1,
                               lVar2);
        (data->state).aptr.rangeline = pcVar1;
      }
      if ((data->state).aptr.rangeline == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_range(struct Curl_easy *data,
                         Curl_HttpReq httpreq)
{
  if(data->state.use_range) {
    /*
     * A range is selected. We use different headers whether we're downloading
     * or uploading and we always let customized headers override our internal
     * ones if any such are specified.
     */
    if(((httpreq == HTTPREQ_GET) || (httpreq == HTTPREQ_HEAD)) &&
       !Curl_checkheaders(data, STRCONST("Range"))) {
      /* if a line like this was already allocated, free the previous one */
      free(data->state.aptr.rangeline);
      data->state.aptr.rangeline = aprintf("Range: bytes=%s\r\n",
                                           data->state.range);
    }
    else if((httpreq == HTTPREQ_POST || httpreq == HTTPREQ_PUT) &&
            !Curl_checkheaders(data, STRCONST("Content-Range"))) {

      /* if a line like this was already allocated, free the previous one */
      free(data->state.aptr.rangeline);

      if(data->set.set_resume_from < 0) {
        /* Upload resume was asked for, but we don't know the size of the
           remote part so we tell the server (and act accordingly) that we
           upload the whole file (again) */
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes 0-%" CURL_FORMAT_CURL_OFF_T
                  "/%" CURL_FORMAT_CURL_OFF_T "\r\n",
                  data->state.infilesize - 1, data->state.infilesize);

      }
      else if(data->state.resume_from) {
        /* This is because "resume" was selected */
        curl_off_t total_expected_size =
          data->state.resume_from + data->state.infilesize;
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes %s%" CURL_FORMAT_CURL_OFF_T
                  "/%" CURL_FORMAT_CURL_OFF_T "\r\n",
                  data->state.range, total_expected_size-1,
                  total_expected_size);
      }
      else {
        /* Range was selected and then we just pass the incoming range and
           append total size */
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes %s/%" CURL_FORMAT_CURL_OFF_T "\r\n",
                  data->state.range, data->state.infilesize);
      }
      if(!data->state.aptr.rangeline)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}